

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes.cc
# Opt level: O2

void __thiscall
cnn::InnerProduct3D_1D_1D::forward_impl
          (InnerProduct3D_1D_1D *this,
          vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_> *xs,Tensor *fx)

{
  pointer ppTVar1;
  TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer> TVar2;
  TensorMap<Eigen::Tensor<float,_3,_0,_long>,_0,_Eigen::MakePointer> A;
  TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer> local_e8;
  TensorMap<Eigen::Tensor<float,_3,_0,_long>,_0,_Eigen::MakePointer> local_d8;
  TensorCwiseBinaryOp<Eigen::internal::scalar_sum_op<float,_float>,_const_Eigen::TensorContractionOp<const_std::array<Eigen::IndexPair<long>,_1UL>,_const_Eigen::TensorContractionOp<const_std::array<Eigen::IndexPair<long>,_1UL>,_const_Eigen::TensorMap<Eigen::Tensor<float,_3,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::NoOpOutputKernel>,_const_Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::NoOpOutputKernel>,_const_Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>_>
  local_b8;
  
  Tensor::t<3>(&local_d8,
               *(xs->super__Vector_base<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>).
                _M_impl.super__Vector_impl_data._M_start);
  TVar2 = Tensor::t<1>((xs->
                       super__Vector_base<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>
                       )._M_impl.super__Vector_impl_data._M_start[1]);
  local_b8.m_lhs_xpr.m_rhs_xpr =
       Tensor::t<1>((xs->
                    super__Vector_base<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>).
                    _M_impl.super__Vector_impl_data._M_start[2]);
  ppTVar1 = (xs->super__Vector_base<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>).
            _M_impl.super__Vector_impl_data._M_start;
  local_b8.m_lhs_xpr.m_lhs_xpr.m_rhs_xpr = TVar2;
  if ((long)(xs->super__Vector_base<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>).
            _M_impl.super__Vector_impl_data._M_finish - (long)ppTVar1 == 0x18) {
    local_b8.m_lhs_xpr.m_lhs_xpr.m_lhs_xpr.m_data = local_d8.m_data;
    local_b8.m_lhs_xpr.m_lhs_xpr.m_lhs_xpr.m_dimensions.super_array<long,_3>._M_elems[0] =
         local_d8.m_dimensions.super_array<long,_3>._M_elems[0];
    local_b8.m_lhs_xpr.m_lhs_xpr.m_lhs_xpr.m_dimensions.super_array<long,_3>._M_elems[1] =
         local_d8.m_dimensions.super_array<long,_3>._M_elems[1];
    local_b8.m_lhs_xpr.m_lhs_xpr.m_lhs_xpr.m_dimensions.super_array<long,_3>._M_elems[2] =
         local_d8.m_dimensions.super_array<long,_3>._M_elems[2];
    local_b8.m_lhs_xpr.m_lhs_xpr.m_indices._M_elems[0].first = 2;
    local_b8.m_lhs_xpr.m_lhs_xpr.m_indices._M_elems[0].second = 0;
    local_b8.m_lhs_xpr.m_indices._M_elems[0].first = 1;
    local_b8.m_lhs_xpr.m_indices._M_elems[0].second = 0;
    local_e8 = Tensor::t<1>(fx);
    Eigen::TensorBase<Eigen::TensorMap<Eigen::Tensor<float,1,0,long>,0,Eigen::MakePointer>,1>::
    operator=((TensorBase<Eigen::TensorMap<Eigen::Tensor<float,1,0,long>,0,Eigen::MakePointer>,1> *)
              &local_e8,&local_b8.m_lhs_xpr);
  }
  else {
    local_b8.m_rhs_xpr = Tensor::t<1>(ppTVar1[3]);
    local_b8.m_lhs_xpr.m_lhs_xpr.m_lhs_xpr.m_data = local_d8.m_data;
    local_b8.m_lhs_xpr.m_lhs_xpr.m_lhs_xpr.m_dimensions.super_array<long,_3>._M_elems[0] =
         local_d8.m_dimensions.super_array<long,_3>._M_elems[0];
    local_b8.m_lhs_xpr.m_lhs_xpr.m_lhs_xpr.m_dimensions.super_array<long,_3>._M_elems[1] =
         local_d8.m_dimensions.super_array<long,_3>._M_elems[1];
    local_b8.m_lhs_xpr.m_lhs_xpr.m_lhs_xpr.m_dimensions.super_array<long,_3>._M_elems[2] =
         local_d8.m_dimensions.super_array<long,_3>._M_elems[2];
    local_b8.m_lhs_xpr.m_lhs_xpr.m_indices._M_elems[0].first = 2;
    local_b8.m_lhs_xpr.m_lhs_xpr.m_indices._M_elems[0].second = 0;
    local_b8.m_lhs_xpr.m_indices._M_elems[0].first = 1;
    local_b8.m_lhs_xpr.m_indices._M_elems[0].second = 0;
    local_e8 = Tensor::t<1>(fx);
    Eigen::TensorBase<Eigen::TensorMap<Eigen::Tensor<float,1,0,long>,0,Eigen::MakePointer>,1>::
    operator=((TensorBase<Eigen::TensorMap<Eigen::Tensor<float,1,0,long>,0,Eigen::MakePointer>,1> *)
              &local_e8,&local_b8);
  }
  return;
}

Assistant:

void InnerProduct3D_1D_1D::forward_impl(const vector<const Tensor*>& xs, Tensor& fx) const {
  auto A = xs[0]->t<3>();
  auto b = xs[1]->t<1>();
  auto c = xs[2]->t<1>();
  typedef Eigen::Tensor<float, 1>::DimensionPair DimPair;
  Eigen::array<DimPair, 1> dims({{DimPair(2, 0)}});
  Eigen::array<DimPair, 1> dims2({{DimPair(1, 0)}});
  if (xs.size() == 3) {
    fx.t<1>() = A.contract(b, dims).contract(c, dims2);
  } else {
    auto d = xs[3]->t<1>();
    fx.t<1>() = A.contract(b, dims).contract(c, dims2) + d;
  }
}